

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symtab.c
# Opt level: O0

void GetMacLine(void)

{
  char cVar1;
  char *pcVar2;
  NameChunk *local_20;
  NameChunk *np;
  char *t;
  char *s;
  
  t = InF->UPtr;
  if (*(char *)&((NameChunk *)t)->Link == '\n') {
    for (local_20 = NameStart; t < local_20 || (NameChunk *)(local_20->Data + 0x3ff) < t;
        local_20 = local_20->Link) {
    }
    InF->UPtr = (char *)local_20->Link->Data;
    t = InF->UPtr;
  }
  np = (NameChunk *)Line;
  do {
    pcVar2 = t + 1;
    cVar1 = *t;
    *(char *)&np->Link = cVar1;
    np = (NameChunk *)((long)&np->Link + 1);
    t = pcVar2;
  } while (cVar1 != '\0');
  InF->UPtr = pcVar2;
  return;
}

Assistant:

void GetMacLine(void)
/* Gets the next stored user macro line. */
{
	register char *s, *t;
	register struct NameChunk *np;

	s = InF->UPtr;
	if (*s == '\n') { /* Continue in next chunk. */
		np = NameStart;
		while ((s < (char *) np) || (s > ((char *) np + CHUNKSIZE)))
			np = np->Link; /* Find the chunk we're in. */
		InF->UPtr = (char *) (np->Link) + sizeof(struct NameChunk *);
		s = InF->UPtr;
	}
	t = Line;
	while ((*t++ = *s++))
		/* Copy InF->UPtr to Line, then bump InF->UPtr. */
		; /*  (It's faster than doing a strcpy followed   */
	InF->UPtr = s; /*  by a strlen to bump the pointer.)           */
}